

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_compress1X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int bmi2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong *puVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong *puVar15;
  
  if (bmi2 != 0) {
    sVar6 = HUF_compress1X_usingCTable_internal_bmi2(dst,dstSize,src,srcSize,CTable);
    return sVar6;
  }
  uVar10 = 0;
  uVar13 = 0;
  if (dstSize < 8) {
    return 0;
  }
  if (dstSize == 8) {
    return 0;
  }
  puVar8 = (ulong *)((long)dst + (dstSize - 8));
  uVar14 = srcSize & 0xfffffffffffffffc;
  uVar5 = (uint)srcSize & 3;
  uVar7 = (ulong)uVar5;
  switch(uVar5) {
  case 0:
    puVar15 = (ulong *)dst;
    goto joined_r0x0010b17e;
  case 1:
    uVar5 = 0;
    goto LAB_0010b115;
  case 2:
    uVar10 = 0;
    break;
  case 3:
    bVar1 = *(byte *)((long)src + uVar14 + 2);
    uVar10 = (ulong)CTable[bVar1].val;
    bVar2 = CTable[bVar1].nbBits;
    uVar13 = (uint)bVar2;
    if (CTable[bVar1].val >> (bVar2 & 0x3f) != 0) goto LAB_0010b31b;
    if (0x3f < bVar2) goto LAB_0010b2fc;
  }
  bVar1 = *(byte *)((long)src + uVar14 + 1);
  if (CTable[bVar1].val >> (CTable[bVar1].nbBits & 0x3f) == 0) {
    uVar5 = CTable[bVar1].nbBits + uVar13;
    if (uVar5 < 0x40) {
      uVar10 = (ulong)CTable[bVar1].val << ((byte)uVar13 & 0x3f) | uVar10;
LAB_0010b115:
      if (CTable[*(byte *)((long)src + uVar14)].val >>
          (CTable[*(byte *)((long)src + uVar14)].nbBits & 0x3f) != 0) goto LAB_0010b31b;
      uVar13 = CTable[*(byte *)((long)src + uVar14)].nbBits + uVar5;
      if (uVar13 < 0x40) {
        if (dst <= puVar8) {
          uVar7 = (ulong)CTable[*(byte *)((long)src + uVar14)].val << ((byte)uVar5 & 0x3f) | uVar10;
          puVar15 = (ulong *)((ulong)(uVar13 >> 3) + (long)dst);
          if (puVar8 < puVar15) {
            puVar15 = puVar8;
          }
          *(ulong *)dst = uVar7;
          uVar10 = (ulong)(uVar13 & 7);
          uVar7 = uVar7 >> ((byte)uVar13 & 0x38);
joined_r0x0010b17e:
          while (uVar14 != 0) {
            bVar1 = *(byte *)((long)src + (uVar14 - 1));
            if (CTable[bVar1].val >> (CTable[bVar1].nbBits & 0x3f) != 0) goto LAB_0010b31b;
            uVar13 = (uint)CTable[bVar1].nbBits + (int)uVar10;
            if (0x3f < uVar13) goto LAB_0010b2fc;
            bVar2 = *(byte *)((long)src + (uVar14 - 2));
            if (CTable[bVar2].val >> (CTable[bVar2].nbBits & 0x3f) != 0) goto LAB_0010b31b;
            uVar5 = CTable[bVar2].nbBits + uVar13;
            if (0x3f < uVar5) goto LAB_0010b2fc;
            bVar3 = *(byte *)((long)src + (uVar14 - 3));
            if (CTable[bVar3].val >> (CTable[bVar3].nbBits & 0x3f) != 0) goto LAB_0010b31b;
            uVar9 = CTable[bVar3].nbBits + uVar5;
            if (0x3f < uVar9) goto LAB_0010b2fc;
            bVar4 = *(byte *)((long)src + (uVar14 - 4));
            if (CTable[bVar4].val >> (CTable[bVar4].nbBits & 0x3f) != 0) goto LAB_0010b31b;
            uVar12 = CTable[bVar4].nbBits + uVar9;
            if (0x3f < uVar12) goto LAB_0010b2fc;
            if (puVar8 < puVar15) goto LAB_0010b33a;
            uVar14 = uVar14 - 4;
            uVar7 = (ulong)CTable[bVar1].val << (sbyte)uVar10 | uVar7 |
                    (ulong)CTable[bVar2].val << ((byte)uVar13 & 0x3f) |
                    (ulong)CTable[bVar3].val << ((byte)uVar5 & 0x3f) |
                    (ulong)CTable[bVar4].val << ((byte)uVar9 & 0x3f);
            puVar11 = (ulong *)((ulong)(uVar12 >> 3) + (long)puVar15);
            if (puVar8 < puVar11) {
              puVar11 = puVar8;
            }
            *puVar15 = uVar7;
            uVar7 = uVar7 >> ((byte)uVar12 & 0x38);
            uVar10 = (ulong)(uVar12 & 7);
            puVar15 = puVar11;
          }
          if (puVar15 <= puVar8) {
            uVar13 = (int)uVar10 + 1;
            puVar11 = (ulong *)((ulong)(uVar13 >> 3) + (long)puVar15);
            if (puVar8 < puVar11) {
              puVar11 = puVar8;
            }
            *puVar15 = uVar7 | 1L << uVar10;
            sVar6 = 0;
            if (puVar11 < puVar8) {
              sVar6 = (long)puVar11 - ((long)dst + ((ulong)((uVar13 & 7) == 0) - 1));
            }
            return sVar6;
          }
        }
LAB_0010b33a:
        __assert_fail("bitC->ptr <= bitC->endPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x607,"void BIT_flushBits(BIT_CStream_t *)");
      }
    }
LAB_0010b2fc:
    __assert_fail("nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5eb,"void BIT_addBitsFast(BIT_CStream_t *, size_t, unsigned int)");
  }
LAB_0010b31b:
  __assert_fail("(value>>nbBits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5ea,"void BIT_addBitsFast(BIT_CStream_t *, size_t, unsigned int)");
}

Assistant:

static size_t
HUF_compress1X_usingCTable_internal(void* dst, size_t dstSize,
                              const void* src, size_t srcSize,
                              const HUF_CElt* CTable, const int bmi2)
{
    if (bmi2) {
        return HUF_compress1X_usingCTable_internal_bmi2(dst, dstSize, src, srcSize, CTable);
    }
    return HUF_compress1X_usingCTable_internal_default(dst, dstSize, src, srcSize, CTable);
}